

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O3

keypress inkey(void)

{
  uint uVar1;
  mouseclick mVar2;
  ui_event_type uVar3;
  uint uVar4;
  undefined4 in_EDX;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ui_event uVar9;
  keypress kVar10;
  
  mVar2.type = EVT_NONE;
  mVar2.x = '\0';
  mVar2.y = '\0';
  mVar2.button = '\0';
  mVar2.mods = '\0';
  uVar6 = 0;
  uVar8 = 0;
  uVar1 = 0;
  do {
    uVar3 = mVar2.type;
    if ((int)uVar3 < 8) {
      if (uVar3 == EVT_KBRD) {
LAB_001d0dbe:
        uVar5 = 1;
        if (uVar3 != EVT_BUTTON) {
          uVar5 = (ulong)mVar2 & 0xffffffff;
        }
        uVar7 = ((uint)uVar8 & 0xff) << 0x10;
        uVar4 = (uint)(ushort)uVar6;
        goto LAB_001d0dfb;
      }
      if (uVar3 == EVT_MOUSE) {
        uVar4 = 0xe000;
        if ((char)uVar8 == '\x01') {
          uVar4 = 10;
        }
LAB_001d0def:
        uVar5 = 1;
        in_EDX = 0;
        uVar7 = 0;
        uVar1 = 0;
LAB_001d0dfb:
        kVar10._0_8_ = (ulong)(uVar1 | uVar4 | uVar7) << 0x20 | uVar5;
        kVar10._8_4_ = in_EDX;
        return kVar10;
      }
    }
    else {
      if (uVar3 == EVT_BUTTON) goto LAB_001d0dbe;
      if (uVar3 == EVT_ESCAPE) {
        uVar4 = 0xe000;
        goto LAB_001d0def;
      }
    }
    uVar9 = inkey_ex();
    in_EDX = uVar9._8_4_;
    mVar2 = uVar9.mouse;
    uVar6 = (ulong)mVar2 >> 0x20;
    uVar8 = (ulong)mVar2 >> 0x30;
    uVar1 = uVar9.key.code & 0xff000000;
  } while( true );
}

Assistant:

struct keypress inkey(void)
{
	ui_event ke = EVENT_EMPTY;

	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD &&
		   ke.type != EVT_MOUSE && ke.type != EVT_BUTTON)
		ke = inkey_ex();

	/* Make the event a keypress */
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_MOUSE) {
		if (ke.mouse.button == 1) {
			ke.type = EVT_KBRD;
			ke.key.code = '\n';
			ke.key.mods = 0;
		} else {
			ke.type = EVT_KBRD;
			ke.key.code = ESCAPE;
			ke.key.mods = 0;
		}
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

	return ke.key;
}